

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

ActionMessage * __thiscall
helics::CommonCore::processMessage(CommonCore *this,ActionMessage *message)

{
  BasicHandleInfo *handle;
  ActionMessage *pAVar1;
  
  handle = HandleManager::getInterfaceHandle
                     (&this->loopHandles,(InterfaceHandle)(message->source_handle).hid,ENDPOINT);
  if (((handle != (BasicHandleInfo *)0x0) &&
      (*(byte *)&message->flags = (byte)message->flags & 0x7f, (handle->flags & 0x800) != 0)) &&
     (this->filterFed != (FilterFederate *)0x0)) {
    pAVar1 = FilterFederate::processMessage(this->filterFed,message,handle);
    return pAVar1;
  }
  return message;
}

Assistant:

ActionMessage& CommonCore::processMessage(ActionMessage& message)
{
    auto* handle = loopHandles.getInterfaceHandle(message.source_handle, InterfaceType::ENDPOINT);
    if (handle == nullptr) {
        return message;
    }
    clearActionFlag(message, filter_processing_required_flag);
    if (checkActionFlag(*handle, has_source_filter_flag)) {
        if (filterFed != nullptr) {
            return filterFed->processMessage(message, handle);
        }
    }

    return message;
}